

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9CompileContinue(jx9_gen_state *pGen)

{
  sxu32 nLine;
  SyToken *pSVar1;
  SyToken *pSVar2;
  sxi32 sVar3;
  sxi64 sVar4;
  GenBlock *pGVar5;
  sxi32 in_EDX;
  sxi32 extraout_EDX;
  int iBlockType;
  sxu32 nInstrIdx;
  JumpFixup sJumpFix;
  
  pSVar1 = pGen->pIn;
  nLine = pSVar1->nLine;
  pSVar2 = pSVar1 + 1;
  pGen->pIn = pSVar2;
  iBlockType = 0;
  if ((pSVar2 < pGen->pEnd) && ((pSVar1[1].nType & 3) != 0)) {
    sVar4 = jx9TokenValueToInt64(&pSVar2->sData);
    iBlockType = 0;
    if (1 < (int)sVar4) {
      iBlockType = (int)sVar4;
    }
    pGen->pIn = pGen->pIn + 1;
    in_EDX = extraout_EDX;
  }
  pGVar5 = GenStateFetchBlock(pGen->pCurrent,iBlockType,in_EDX);
  if (pGVar5 == (GenBlock *)0x0) {
    sVar3 = jx9GenCompileError(pGen,1,nLine,
                               "A \'continue\' statement may only be used within a loop or switch");
    if (sVar3 == -10) {
      return -10;
    }
  }
  else {
    nInstrIdx = 0;
    jx9VmEmitInstr(pGen->pVm,8,0,pGVar5->nFirstInstr,(void *)0x0,&nInstrIdx);
    if (pGVar5->bPostContinue == '\x01') {
      sJumpFix.nJumpType = 8;
      sJumpFix.nInstrIdx = nInstrIdx;
      SySetPut(&pGVar5->aPostContFix,&sJumpFix);
    }
  }
  pSVar2 = pGen->pIn;
  if ((pSVar2 < pGen->pEnd) && ((pSVar2->nType & 0x40000) == 0)) {
    jx9GenCompileError(pGen,2,pSVar2->nLine,"Expected semi-colon \';\' after \'continue\' statement"
                      );
  }
  return 0;
}

Assistant:

static sxi32 jx9CompileContinue(jx9_gen_state *pGen)
{
	GenBlock *pLoop; /* Target loop */
	sxi32 iLevel;    /* How many nesting loop to skip */
	sxu32 nLine;
	sxi32 rc;
	nLine = pGen->pIn->nLine;
	iLevel = 0;
	/* Jump the 'continue' keyword */
	pGen->pIn++;
	if( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_NUM) ){
		/* optional numeric argument which tells us how many levels
		 * of enclosing loops we should skip to the end of. 
		 */
		iLevel = (sxi32)jx9TokenValueToInt64(&pGen->pIn->sData);
		if( iLevel < 2 ){
			iLevel = 0;
		}
		pGen->pIn++; /* Jump the optional numeric argument */
	}
	/* Point to the target loop */
	pLoop = GenStateFetchBlock(pGen->pCurrent, GEN_BLOCK_LOOP, iLevel);
	if( pLoop == 0 ){
		/* Illegal continue */
		rc = jx9GenCompileError(pGen, E_ERROR, nLine, "A 'continue' statement may only be used within a loop or switch");
		if( rc == SXERR_ABORT ){
			/* Error count limit reached, abort immediately */
			return SXERR_ABORT;
		}
	}else{
		sxu32 nInstrIdx = 0;
		/* Emit the unconditional jump to the beginning of the target loop */
		jx9VmEmitInstr(pGen->pVm, JX9_OP_JMP, 0, pLoop->nFirstInstr, 0, &nInstrIdx);
		if( pLoop->bPostContinue == TRUE ){
			JumpFixup sJumpFix;
			/* Post-continue */
			sJumpFix.nJumpType = JX9_OP_JMP;
			sJumpFix.nInstrIdx = nInstrIdx;
			SySetPut(&pLoop->aPostContFix, (const void *)&sJumpFix);
		}
	}
	if( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_SEMI) == 0 ){
		/* Not so fatal, emit a warning only */
		jx9GenCompileError(&(*pGen), E_WARNING, pGen->pIn->nLine, "Expected semi-colon ';' after 'continue' statement");
	}
	/* Statement successfully compiled */
	return SXRET_OK;
}